

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.cc
# Opt level: O3

void __thiscall absl::lts_20250127::crc_internal::CrcCordState::Poison(CrcCordState *this)

{
  RefcountedRep *pRVar1;
  _Elt_pointer pPVar2;
  Rep *pRVar3;
  _Map_pointer ppPVar4;
  PrefixCrc *prefix_crc;
  _Elt_pointer pPVar5;
  _Elt_pointer pPVar6;
  uint uVar7;
  crc32c_t local_10;
  int local_c;
  
  pRVar3 = mutable_rep(this);
  pRVar1 = this->refcounted_rep_;
  ppPVar4 = (pRVar1->rep).prefix_crc.
            super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(pRVar1->rep).prefix_crc.
             super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(pRVar1->rep).prefix_crc.
             super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
      ((long)(pRVar1->rep).prefix_crc.
             super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(pRVar1->rep).prefix_crc.
             super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
      ((((ulong)((long)ppPVar4 -
                (long)(pRVar1->rep).prefix_crc.
                      super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(ppPVar4 == (_Map_pointer)0x0)) * 0x20 == 0) {
    local_c = 0;
    local_10.crc_ = 1;
    std::
    deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>>
    ::emplace_back<int,absl::lts_20250127::crc32c_t>
              ((deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>>
                *)&pRVar3->prefix_crc,&local_c,&local_10);
  }
  else {
    pPVar5 = (pRVar3->prefix_crc).
             super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pPVar2 = (pRVar3->prefix_crc).
             super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pPVar5 != pPVar2) {
      pPVar6 = (pRVar3->prefix_crc).
               super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppPVar4 = (pRVar3->prefix_crc).
                super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        uVar7 = (pPVar5->crc).crc_ + 0x2e76e41b;
        (pPVar5->crc).crc_ = uVar7 * 0x8000 | uVar7 >> 0x11;
        pPVar5 = pPVar5 + 1;
        if (pPVar5 == pPVar6) {
          pPVar5 = ppPVar4[1];
          ppPVar4 = ppPVar4 + 1;
          pPVar6 = pPVar5 + 0x20;
        }
      } while (pPVar5 != pPVar2);
    }
  }
  return;
}

Assistant:

void CrcCordState::Poison() {
  Rep* rep = mutable_rep();
  if (NumChunks() > 0) {
    for (auto& prefix_crc : rep->prefix_crc) {
      // This is basically CRC32::Scramble().
      uint32_t crc = static_cast<uint32_t>(prefix_crc.crc);
      crc += 0x2e76e41b;
      crc = absl::rotr(crc, 17);
      prefix_crc.crc = crc32c_t{crc};
    }
  } else {
    // Add a fake corrupt chunk.
    rep->prefix_crc.emplace_back(0, crc32c_t{1});
  }
}